

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_channel_id_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((hs->field_0x6cb & 1) != 0) {
    iVar1 = CBB_add_u16(out,0x7550);
    if (iVar1 == 0) {
      bVar2 = false;
    }
    else {
      iVar1 = CBB_add_u16(out,0);
      bVar2 = iVar1 != 0;
    }
  }
  return bVar2;
}

Assistant:

static bool ext_channel_id_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  if (!hs->channel_id_negotiated) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_channel_id) ||
      !CBB_add_u16(out, 0 /* length */)) {
    return false;
  }

  return true;
}